

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1620:15)>
::getImpl(TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1620:15)>
          *this,ExceptionOrValue *output)

{
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  Maybe<kj::Exception> *pMVar1;
  Exception *depException;
  Exception *other;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::_::Void> local_360;
  ExceptionOrValue local_1c0;
  char local_28;
  
  local_1c0.exception.ptr.isSet = false;
  local_28 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1c0);
  this_00 = &local_1c0.exception.ptr.field_1;
  other = (Exception *)0x0;
  if (local_1c0.exception.ptr.isSet != false) {
    other = (Exception *)this_00;
  }
  if (local_1c0.exception.ptr.isSet == true) {
    pMVar1 = (this->errorHandler).maybeException;
    if ((pMVar1->ptr).isSet == true) {
      (pMVar1->ptr).isSet = false;
      Exception::~Exception(&(pMVar1->ptr).field_1.value);
    }
    Exception::Exception(&(pMVar1->ptr).field_1.value,other);
    (pMVar1->ptr).isSet = true;
    local_360.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_360.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_360);
  }
  else {
    if (local_28 != '\x01') goto LAB_0021fa7f;
    local_360.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_360.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_360);
  }
  if (local_360.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_360.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0021fa7f:
  if (local_1c0.exception.ptr.isSet == true) {
    Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }